

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::RawBufferCopySync_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  EventKind EVar1;
  int64 iVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Var aValue;
  Var aValue_00;
  ArrayBuffer *pAVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if (evt->EventKind != RawBufferCopySync) {
    TTDAbort_unrecoverable_error("Bad tag match!");
  }
  aValue = InflateVarInReplay(executeContext,*(TTDVar *)(evt + 1));
  aValue_00 = InflateVarInReplay(executeContext,(TTDVar)evt[1].EventTimeStamp);
  bVar3 = Js::VarIs<Js::ArrayBuffer>(aValue);
  if (bVar3) {
    bVar3 = Js::VarIs<Js::ArrayBuffer>(aValue_00);
    if (bVar3) {
      iVar2 = evt[2].EventTimeStamp;
      EVar1 = evt[2].EventKind;
      pAVar7 = Js::VarTo<Js::ArrayBuffer>(aValue);
      uVar4 = (*(pAVar7->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x71])(pAVar7);
      if ((int)iVar2 + EVar1 <= uVar4) {
        iVar2 = evt[2].EventTimeStamp;
        iVar5 = evt[2].ResultStatus;
        pAVar7 = Js::VarTo<Js::ArrayBuffer>(aValue_00);
        uVar4 = (*(pAVar7->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x71])(pAVar7);
        if ((uint)((int)iVar2 + iVar5) <= uVar4) {
          pAVar7 = Js::VarTo<Js::ArrayBuffer>(aValue);
          iVar5 = (*(pAVar7->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x72])(pAVar7);
          EVar1 = evt[2].EventKind;
          pAVar7 = Js::VarTo<Js::ArrayBuffer>(aValue_00);
          iVar6 = (*(pAVar7->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x72])(pAVar7);
          memmove_xplat((void *)((ulong)EVar1 + CONCAT44(extraout_var,iVar5)),
                        (void *)((ulong)(uint)evt[2].ResultStatus + CONCAT44(extraout_var_00,iVar6))
                        ,(ulong)(uint)evt[2].EventTimeStamp);
          return;
        }
      }
      TTDAbort_unrecoverable_error("Copy off end of buffer!!!");
    }
  }
  TTDAbort_unrecoverable_error("Not array buffer objects!!!");
}

Assistant:

void RawBufferCopySync_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            const JsRTRawBufferCopyAction* action = GetInlineEventDataAs<JsRTRawBufferCopyAction, EventKind::RawBufferCopySync>(evt);
            Js::Var dst = InflateVarInReplay(executeContext, action->Dst); //never cross context
            Js::Var src = InflateVarInReplay(executeContext, action->Src); //never cross context

            TTDAssert(Js::VarIs<Js::ArrayBuffer>(dst) && Js::VarIs<Js::ArrayBuffer>(src), "Not array buffer objects!!!");
            TTDAssert(action->DstIndx + action->Count <= Js::VarTo<Js::ArrayBuffer>(dst)->GetByteLength(), "Copy off end of buffer!!!");
            TTDAssert(action->SrcIndx + action->Count <= Js::VarTo<Js::ArrayBuffer>(src)->GetByteLength(), "Copy off end of buffer!!!");

            byte* dstBuff = Js::VarTo<Js::ArrayBuffer>(dst)->GetBuffer() + action->DstIndx;
            byte* srcBuff = Js::VarTo<Js::ArrayBuffer>(src)->GetBuffer() + action->SrcIndx;

            //node uses mmove so we do too
            memmove(dstBuff, srcBuff, action->Count);
        }